

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::StripFileName(string *__return_storage_ptr__,string *filepath)

{
  allocator<char> local_21;
  long local_20;
  size_t i;
  string *filepath_local;
  
  i = (size_t)filepath;
  filepath_local = __return_storage_ptr__;
  local_20 = std::__cxx11::string::find_last_of((char *)filepath,(ulong)PathSeparatorSet);
  if (local_20 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,i);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripFileName(const std::string &filepath) {
  size_t i = filepath.find_last_of(PathSeparatorSet);
  return i != std::string::npos ? filepath.substr(0, i) : "";
}